

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_tab.c
# Opt level: O1

GCtab * lj_tab_new(lua_State *L,uint32_t asize,uint32_t hbits)

{
  uint32_t uVar1;
  undefined1 auVar2 [16];
  GCtab *pGVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  int iVar9;
  undefined1 auVar8 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  int iVar13;
  
  pGVar3 = newtab(L,asize,hbits);
  auVar2 = _DAT_00157190;
  uVar5 = (ulong)pGVar3->asize;
  if (uVar5 != 0) {
    uVar4 = (ulong)(pGVar3->array).ptr32;
    lVar7 = uVar5 - 1;
    auVar8._8_4_ = (int)lVar7;
    auVar8._0_8_ = lVar7;
    auVar8._12_4_ = (int)((ulong)lVar7 >> 0x20);
    uVar6 = 0;
    auVar8 = auVar8 ^ _DAT_00157190;
    auVar10 = _DAT_00157170;
    auVar11 = _DAT_00157180;
    do {
      auVar12 = auVar11 ^ auVar2;
      iVar9 = auVar8._4_4_;
      if ((bool)(~(auVar12._4_4_ == iVar9 && auVar8._0_4_ < auVar12._0_4_ || iVar9 < auVar12._4_4_)
                & 1)) {
        *(undefined4 *)(uVar4 + 4 + uVar6) = 0xffffffff;
      }
      if ((auVar12._12_4_ != auVar8._12_4_ || auVar12._8_4_ <= auVar8._8_4_) &&
          auVar12._12_4_ <= auVar8._12_4_) {
        *(undefined4 *)(uVar4 + 0xc + uVar6) = 0xffffffff;
      }
      auVar12 = auVar10 ^ auVar2;
      iVar13 = auVar12._4_4_;
      if (iVar13 <= iVar9 && (iVar13 != iVar9 || auVar12._0_4_ <= auVar8._0_4_)) {
        *(undefined4 *)(uVar4 + 0x14 + uVar6) = 0xffffffff;
        *(undefined4 *)(uVar4 + 0x1c + uVar6) = 0xffffffff;
      }
      lVar7 = auVar11._8_8_;
      auVar11._0_8_ = auVar11._0_8_ + 4;
      auVar11._8_8_ = lVar7 + 4;
      lVar7 = auVar10._8_8_;
      auVar10._0_8_ = auVar10._0_8_ + 4;
      auVar10._8_8_ = lVar7 + 4;
      uVar6 = uVar6 + 0x20;
    } while ((uVar5 * 8 + 0x18 & 0xffffffffffffffe0) != uVar6);
  }
  uVar1 = pGVar3->hmask;
  if (uVar1 != 0) {
    uVar5 = (ulong)(pGVar3->node).ptr32;
    lVar7 = 0;
    do {
      *(undefined8 *)(uVar5 + 0xc + lVar7) = 0xffffffff;
      *(undefined4 *)(uVar5 + 4 + lVar7) = 0xffffffff;
      lVar7 = lVar7 + 0x18;
    } while ((ulong)(uVar1 + 1 + (uint)(uVar1 == 0xffffffff)) * 0x18 != lVar7);
  }
  return pGVar3;
}

Assistant:

GCtab *lj_tab_new(lua_State *L, uint32_t asize, uint32_t hbits)
{
  GCtab *t = newtab(L, asize, hbits);
  clearapart(t);
  if (t->hmask > 0) clearhpart(t);
  return t;
}